

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.hpp
# Opt level: O3

void __thiscall duckdb::CSVError::CSVError(CSVError *this)

{
  (this->error_message)._M_dataplus._M_p = (pointer)&(this->error_message).field_2;
  (this->error_message)._M_string_length = 0;
  (this->error_message).field_2._M_local_buf[0] = '\0';
  (this->full_error_message)._M_dataplus._M_p = (pointer)&(this->full_error_message).field_2;
  (this->full_error_message)._M_string_length = 0;
  (this->full_error_message).field_2._M_local_buf[0] = '\0';
  this->type = CAST_ERROR;
  this->column_idx = 0;
  (this->csv_row)._M_dataplus._M_p = (pointer)&(this->csv_row).field_2;
  (this->csv_row)._M_string_length = 0;
  (this->csv_row).field_2._M_local_buf[0] = '\0';
  LinesPerBoundary::LinesPerBoundary(&this->error_info);
  this->row_byte_position = 0;
  (this->byte_position).index = 0xffffffffffffffff;
  return;
}

Assistant:

CSVError() {}